

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> __thiscall
kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
find<capnp::StructSchema&>
          (HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>> *this,
          StructSchema *key)

{
  Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> MVar1;
  long lVar2;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
  table;
  HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
  local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
  ::
  find<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,capnp::StructSchema&>
            (local_20,table,(StructSchema *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 5));
  lVar2 = 0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
       )0x0) {
    lVar2 = local_18 * 0x20 + *(long *)this;
  }
  MVar1.ptr = (Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)(lVar2 + 0x10);
  if (lVar2 == 0) {
    MVar1.ptr = (Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_> *)0x0;
  }
  return (Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}